

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::SubElement
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,int is)

{
  ostream *this_00;
  void *this_01;
  int in_ESI;
  
  if ((in_ESI < 0) || (1 < in_ESI)) {
    this_00 = std::operator<<((ostream *)&std::cout,"TPZGeoElRefLess::SubElement index error is= ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return (TPZGeoEl *)0x0;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::SubElement(int is) const {
	if(is<0 || is>1){//(TRef::NSubEl - 1)){
		std::cout << "TPZGeoElRefLess::SubElement index error is= " << is << std::endl;
	}
	//  return fSubEl[is];
	return 0;
}